

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_spy_ImportEnumerator.cpp
# Opt level: O1

ImportIterator * __thiscall axl::spy::ImportIterator::operator++(ImportIterator *this)

{
  ElfImportEnumeration *pEVar1;
  
  pEVar1 = (this->m_enumeration).m_p;
  if ((pEVar1 == (ElfImportEnumeration *)0x0) ||
     (pEVar1->m_gotRelCount + pEVar1->m_pltRelCount <= this->m_index)) {
    ImportIteratorBase::reset(&this->super_ImportIteratorBase);
  }
  else {
    this->m_index = this->m_index + 1;
    readRel(this);
  }
  return this;
}

Assistant:

ImportIterator&
ImportIterator::operator ++ () {
	if (!m_enumeration ||
		m_index >= m_enumeration->m_pltRelCount + m_enumeration->m_gotRelCount) {
		reset();
		return *this;
	}

	m_index++;
	readRel();
	return *this;
}